

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_hmask.c
# Opt level: O0

void aom_blend_a64_hmask_c
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,int w,int h)

{
  int j;
  int i;
  uint32_t src1_stride_local;
  uint8_t *src1_local;
  uint32_t src0_stride_local;
  uint8_t *src0_local;
  uint32_t dst_stride_local;
  uint8_t *dst_local;
  
  for (i = 0; i < h; i = i + 1) {
    for (j = 0; j < w; j = j + 1) {
      dst[i * dst_stride + j] =
           (uint8_t)((int)((uint)mask[j] * (uint)src0[i * src0_stride + j] +
                           (0x40 - (uint)mask[j]) * (uint)src1[i * src1_stride + j] + 0x20) >> 6);
    }
  }
  return;
}

Assistant:

void aom_blend_a64_hmask_c(uint8_t *dst, uint32_t dst_stride,
                           const uint8_t *src0, uint32_t src0_stride,
                           const uint8_t *src1, uint32_t src1_stride,
                           const uint8_t *mask, int w, int h) {
  int i, j;

  assert(IMPLIES(src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES(src1 == dst, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  for (i = 0; i < h; ++i) {
    for (j = 0; j < w; ++j) {
      dst[i * dst_stride + j] = AOM_BLEND_A64(
          mask[j], src0[i * src0_stride + j], src1[i * src1_stride + j]);
    }
  }
}